

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

reference andres::marray_detail::AccessOperatorHelper<true>::
          execute<TestType,int,false,std::allocator<unsigned_long>>
                    (View<TestType,_false,_std::allocator<unsigned_long>_> *v,int *index)

{
  size_t sVar1;
  bool local_21;
  size_t local_20;
  size_t offset;
  int *index_local;
  View<TestType,_false,_std::allocator<unsigned_long>_> *v_local;
  
  offset = (size_t)index;
  index_local = (int *)v;
  View<TestType,_false,_std::allocator<unsigned_long>_>::testInvariant(v);
  Assert<bool>(*(long *)index_local != 0);
  sVar1 = View<TestType,_false,_std::allocator<unsigned_long>_>::dimension
                    ((View<TestType,_false,_std::allocator<unsigned_long>_> *)index_local);
  local_21 = true;
  if (sVar1 == 0) {
    local_21 = *(int *)offset == 0;
  }
  Assert<bool>(local_21);
  View<TestType,_false,_std::allocator<unsigned_long>_>::indexToOffset
            ((View<TestType,_false,_std::allocator<unsigned_long>_> *)index_local,
             (long)*(int *)offset,&local_20);
  return (reference)(*(long *)index_local + local_20 * 8);
}

Assistant:

static typename View<T, isConst, A>::reference
    execute(const View<T, isConst, A>& v, const U& index)
    {
        v.testInvariant();
        Assert(MARRAY_NO_DEBUG || v.data_ != 0);
        Assert(MARRAY_NO_DEBUG || v.dimension() != 0 || index == 0);
        std::size_t offset;
        v.indexToOffset(index, offset);
        return v.data_[offset];
    }